

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_leadingNumbers.cpp
# Opt level: O3

void __thiscall
leadingNumbers_parenthesisSingle_Test::~leadingNumbers_parenthesisSingle_Test
          (leadingNumbers_parenthesisSingle_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(leadingNumbers, parenthesisSingle)
{
    size_t index{0U};
    auto res = testLeadingNumber("(4.3)", index);
    EXPECT_EQ(res, 4.3);
    EXPECT_GE(index, 5U);

    res = testLeadingNumber("1.2*(-2.4)", index);
    EXPECT_EQ(res, 1.2 * -2.4);

    res = testLeadingNumber("3.1^(4.3)houses", index);
    EXPECT_EQ(res, pow(3.1, 4.3));
    EXPECT_GE(index, 9U);

    res = testLeadingNumber("1.2*-.9", index);
    EXPECT_EQ(res, 1.2 * -0.9);

    res = testLeadingNumber("1.2*", index);
    EXPECT_EQ(res, 1.2);
}